

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

ssize_t __thiscall Fl_Type::write(Fl_Type *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  ssize_t sVar5;
  ssize_t extraout_RAX;
  Fl_Type *local_20;
  Fl_Type *child;
  char *p;
  Fl_Type *this_local;
  undefined4 extraout_var_00;
  
  write_indent(this->level);
  iVar2 = (*this->_vptr_Fl_Type[5])();
  write_word((char *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*this->_vptr_Fl_Type[0x26])();
  if (((iVar2 != 0) &&
      (pcVar3 = Fl_Class_Type::prefix((Fl_Class_Type *)this), pcVar3 != (char *)0x0)) &&
     (sVar4 = strlen(pcVar3), sVar4 != 0)) {
    write_word(pcVar3);
  }
  pcVar3 = name(this);
  write_word(pcVar3);
  write_open(this->level);
  (*this->_vptr_Fl_Type[0xd])();
  write_close(this->level);
  iVar2 = (*this->_vptr_Fl_Type[0x16])();
  sVar5 = CONCAT44(extraout_var_00,iVar2);
  if (iVar2 != 0) {
    write_open(this->level);
    local_20 = this->next;
    while( true ) {
      bVar1 = false;
      if (local_20 != (Fl_Type *)0x0) {
        bVar1 = this->level < local_20->level;
      }
      if (!bVar1) break;
      if (local_20->level == this->level + 1) {
        (*local_20->_vptr_Fl_Type[0xc])();
      }
      local_20 = local_20->next;
    }
    write_close(this->level);
    sVar5 = extraout_RAX;
  }
  return sVar5;
}

Assistant:

void Fl_Type::write() {
    write_indent(level);
    write_word(type_name());
    
    if (is_class()) {
      const char * p = 	((Fl_Class_Type*)this)->prefix();
      if (p &&	strlen(p))
        write_word(p);
    }

    write_word(name());
    write_open(level);
    write_properties();
    write_close(level);
    if (!is_parent()) return;
    // now do children:
    write_open(level);
    Fl_Type *child;
    for (child = next; child && child->level > level; child = child->next)
	if (child->level == level+1) child->write();
    write_close(level);
}